

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printFileAndLineForFailure(TestOutput *this,TestFailure *failure)

{
  ulong uVar1;
  long *plVar2;
  undefined4 uVar3;
  long *in_RSI;
  SimpleString *in_RDI;
  TestOutput *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffc8;
  TestOutput *in_stack_ffffffffffffffd0;
  undefined1 local_18 [12];
  
  unique0x100000e7 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_18);
  uVar3 = (**(code **)(*stack0xfffffffffffffff0 + 0x28))();
  plVar2 = stack0xfffffffffffffff0;
  uVar1 = (ulong)stack0xfffffffffffffff0 >> 0x20;
  printErrorInFileOnLineFormattedForWorkingEnvironment(unaff_retaddr,in_RDI,(int)uVar1);
  stack0xfffffffffffffff0 = plVar2;
  SimpleString::~SimpleString((SimpleString *)0x213d3e);
  (**(code **)(*stack0xfffffffffffffff0 + 0x18))();
  printFailureInTest(in_stack_ffffffffffffffd0,
                     (SimpleString *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
  SimpleString::~SimpleString((SimpleString *)0x213d6f);
  return;
}

Assistant:

void TestOutput::printFileAndLineForFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
    printFailureInTest(failure.getTestName());
}